

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_lockbitmap.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _Bool redraw;
  int lock_flags;
  Mode mode;
  ALLEGRO_EVENT event;
  ALLEGRO_EVENT_QUEUE *events;
  ALLEGRO_DISPLAY *display;
  int local_70;
  Mode local_6c;
  int local_68 [4];
  int in_stack_ffffffffffffffa8;
  Mode in_stack_ffffffffffffffac;
  ALLEGRO_DISPLAY *in_stack_ffffffffffffffb0;
  int local_48;
  int local_44;
  int local_28;
  
  local_6c = MODE_VIDEO;
  local_70 = 2;
  bVar1 = true;
  uVar3 = al_install_system(0x85020700,atexit);
  if ((uVar3 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_install_keyboard();
  al_install_mouse();
  al_install_touch_input();
  open_log();
  lVar4 = al_create_display(0x300,0x100);
  if (lVar4 == 0) {
    abort_example("Error creating display\n");
  }
  uVar5 = al_create_event_queue();
  uVar6 = al_get_keyboard_event_source();
  al_register_event_source(uVar5,uVar6);
  uVar6 = al_get_mouse_event_source();
  al_register_event_source(uVar5,uVar6);
  uVar3 = al_is_touch_input_installed();
  if ((uVar3 & 1) != 0) {
    uVar6 = al_get_touch_input_mouse_emulation_event_source();
    al_register_event_source(uVar5,uVar6);
  }
  log_printf("Press space to change bitmap type\n");
  log_printf("Press w to toggle WRITEONLY mode\n");
  while( true ) {
    while( true ) {
      if (bVar1) {
        draw(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
        bVar1 = false;
      }
      al_wait_for_event(uVar5,local_68);
      if (local_68[0] == 0xb) break;
      if ((local_68[0] == 0x15) && (local_28 == 1)) {
        iVar2 = al_get_display_width(lVar4);
        if (local_48 < iVar2 / 2) {
          local_6c = cycle_mode(local_6c);
        }
        else {
          local_70 = toggle_writeonly(local_70);
        }
        bVar1 = true;
      }
    }
    if (local_48 == 0x3b) break;
    if (local_44 == 0x20) {
      local_6c = cycle_mode(local_6c);
      bVar1 = true;
    }
    else if ((local_44 == 0x77) || (local_44 == 0x57)) {
      local_70 = toggle_writeonly(local_70);
      bVar1 = true;
    }
  }
  close_log(false);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_EVENT_QUEUE *events;
   ALLEGRO_EVENT event;
   enum Mode mode = MODE_VIDEO;
   int lock_flags = ALLEGRO_LOCK_WRITEONLY;
   bool redraw = true;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_install_mouse();
   al_install_touch_input();

   open_log();

   /* Create a window. */
   display = al_create_display(3*256, 256);
   if (!display) {
      abort_example("Error creating display\n");
   }

   events = al_create_event_queue();
   al_register_event_source(events, al_get_keyboard_event_source());
   al_register_event_source(events, al_get_mouse_event_source());
   if (al_is_touch_input_installed()) {
      al_register_event_source(events,
         al_get_touch_input_mouse_emulation_event_source());
   }

   log_printf("Press space to change bitmap type\n");
   log_printf("Press w to toggle WRITEONLY mode\n");

   for (;;) {
      if (redraw) {
         draw(display, mode, lock_flags);
         redraw = false;
      }

      al_wait_for_event(events, &event);
      if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
            break;
         if (event.keyboard.unichar == ' ') {
            mode = cycle_mode(mode);
            redraw = true;
         }
         else if (event.keyboard.unichar == 'w' || event.keyboard.unichar == 'W') {
            lock_flags = toggle_writeonly(lock_flags);
            redraw = true;
         }
      }
      else if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         if (event.mouse.button == 1) {
            if (event.mouse.x < al_get_display_width(display) / 2) {
               mode = cycle_mode(mode);
            }
            else {
               lock_flags = toggle_writeonly(lock_flags);
            }
            redraw = true;
         }
      }
   }

   close_log(false);
   return 0;
}